

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive_manifest.cpp
# Opt level: O3

bool __thiscall
ON_ComponentIdHash32Table::RemoveManifestItem
          (ON_ComponentIdHash32Table *this,ON_ComponentManifestItem_PRIVATE *manifest_item)

{
  ON_FixedSizePool *this_00;
  ON_UUID *pOVar1;
  bool bVar2;
  ON__UINT32 hash32;
  ON_UUID *pOVar3;
  ON_Hash32TableItem *item;
  ON_UUID id;
  ON_UUID_struct local_30;
  
  pOVar3 = &(manifest_item->super_ON_ComponentManifestItem).m_id;
  if (manifest_item == (ON_ComponentManifestItem_PRIVATE *)0x0) {
    pOVar3 = &ON_nil_uuid;
  }
  pOVar1 = &ON_nil_uuid;
  if (manifest_item != (ON_ComponentManifestItem_PRIVATE *)0x0) {
    pOVar1 = &(manifest_item->super_ON_ComponentManifestItem).m_id;
  }
  local_30.Data4 = *&pOVar1->Data4;
  local_30.Data1 = pOVar3->Data1;
  local_30.Data2 = pOVar3->Data2;
  local_30.Data3 = pOVar3->Data3;
  bVar2 = ::operator==(&ON_nil_uuid,&local_30);
  if (!bVar2) {
    hash32 = ON_CRC32(0,0x10,&local_30);
    item = ON_Hash32Table::FirstItemWithHash(&this->super_ON_Hash32Table,hash32);
    if (item == (ON_Hash32TableItem *)0x0) {
      return false;
    }
    do {
      if (((ON_ComponentManifestItem_PRIVATE *)item[1].m_internal_next == manifest_item) &&
         (bVar2 = ON_Hash32Table::RemoveItem(&this->super_ON_Hash32Table,item), bVar2)) {
        this_00 = &this->m_fsp->super_ON_FixedSizePool;
        item[1].m_internal_next = (ON_Hash32TableItem *)0x0;
        ON_FixedSizePool::ReturnElement(this_00,item);
        return true;
      }
      item = ON_Hash32Table::NextItemWithHash(&this->super_ON_Hash32Table,item);
    } while (item != (ON_Hash32TableItem *)0x0);
  }
  return false;
}

Assistant:

bool RemoveManifestItem(
    const class ON_ComponentManifestItem_PRIVATE* manifest_item
    )
  {
    const ON_UUID id = IdFromManifestItem(manifest_item);
    if ( ON_nil_uuid == id )
      return false;
    const ON__UINT32 hash32 = ON_ComponentIdHash32Table::IdHash32(id);

    for (const ON_Hash32TableItem* hash_table_item = FirstItemWithHash(hash32); nullptr != hash_table_item; hash_table_item = NextItemWithHash(hash_table_item))
    {
      if (manifest_item == ((const ON_ComponentManifestHash32TableItem*)hash_table_item)->m_manifest_item)
      {
        if (RemoveItem(const_cast<ON_Hash32TableItem*>(hash_table_item)))
        {
          m_fsp.ReturnHashTableItem((ON_ComponentManifestHash32TableItem*)hash_table_item);
          return true;
        }
      }
    }

    return false;
  }